

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BG_FactorGraphCreator.cpp
# Opt level: O2

void __thiscall
BG_FactorGraphCreator::Construct_AgentTypePair_Variables(BG_FactorGraphCreator *this)

{
  pointer pvVar1;
  element_type *peVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_t sVar4;
  ostream *poVar5;
  size_t __n;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  Index tI;
  ulong uVar9;
  size_type __n_00;
  Index atI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrTypes;
  Var v;
  value_type_conflict1 local_64;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *local_60;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  value_type local_40;
  
  iVar3 = (*(((this->_m_bg).px)->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
            super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
            _vptr_Interface_ProblemToPolicyDiscrete[3])();
  local_60 = &this->_m_var_indices;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::resize(&this->_m_var_indices,CONCAT44(extraout_var,iVar3));
  iVar3 = (*(((this->_m_bg).px)->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
            super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
            _vptr_Interface_ProblemToPolicyDiscrete[3])();
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_58,
             CONCAT44(extraout_var_00,iVar3),(allocator_type *)&local_40);
  __n_00 = 0;
  uVar7 = 0;
  while( true ) {
    iVar3 = (*(((this->_m_bg).px)->super_BayesianGameIdenticalPayoffInterface).
              super_BayesianGameBase.super_Interface_ProblemToPolicyDiscretePure.
              super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete[3])();
    uVar8 = (ulong)uVar7;
    if (CONCAT44(extraout_var_01,iVar3) <= uVar8) break;
    sVar4 = BayesianGameBase::GetNrTypes((BayesianGameBase *)(this->_m_bg).px,uVar7);
    local_58._M_impl.super__Vector_impl_data._M_start[uVar8] = sVar4;
    if (1 < this->_m_verbosity) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Agent ");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      poVar5 = std::operator<<(poVar5," has ");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      poVar5 = std::operator<<(poVar5," types.");
      std::endl<char,std::char_traits<char>>(poVar5);
      sVar4 = local_58._M_impl.super__Vector_impl_data._M_start[uVar8];
    }
    pvVar1 = (this->_m_var_indices).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    __n = BayesianGameBase::GetNrTypes((BayesianGameBase *)(this->_m_bg).px,uVar7);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(pvVar1 + uVar8,__n);
    __n_00 = __n_00 + sVar4;
    uVar7 = uVar7 + 1;
  }
  if (0 < this->_m_verbosity) {
    poVar5 = std::operator<<((ostream *)&std::cout,"FactorGraph has ");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5," variables (agent-types)");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  uVar7 = 0;
  while( true ) {
    iVar3 = (*(((this->_m_bg).px)->super_BayesianGameIdenticalPayoffInterface).
              super_BayesianGameBase.super_Interface_ProblemToPolicyDiscretePure.
              super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete[3])();
    uVar8 = (ulong)uVar7;
    if (CONCAT44(extraout_var_02,iVar3) <= uVar8) break;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              ((local_60->
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + uVar8,
               local_58._M_impl.super__Vector_impl_data._M_start[uVar8]);
    uVar7 = uVar7 + 1;
  }
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::reserve(&this->_m_vars,__n_00);
  uVar7 = 0;
  local_64 = 0;
  while( true ) {
    iVar3 = (*(((this->_m_bg).px)->super_BayesianGameIdenticalPayoffInterface).
              super_BayesianGameBase.super_Interface_ProblemToPolicyDiscretePure.
              super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete[3])();
    uVar8 = (ulong)uVar7;
    if (CONCAT44(extraout_var_03,iVar3) <= uVar8) break;
    uVar9 = 0;
    while( true ) {
      sVar4 = BayesianGameBase::GetNrTypes((BayesianGameBase *)(this->_m_bg).px,uVar7);
      if (sVar4 <= uVar9) break;
      peVar2 = (this->_m_bg).px;
      uVar6 = (ulong)local_64;
      iVar3 = (*(peVar2->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
                super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
                _vptr_Interface_ProblemToPolicyDiscrete[4])(peVar2,uVar8);
      local_40._states = CONCAT44(extraout_var_04,iVar3);
      local_40._label = uVar6;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((local_60->
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + uVar8,&local_64);
      std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::push_back(&this->_m_vars,&local_40);
      local_64 = local_64 + 1;
      uVar9 = (ulong)((int)uVar9 + 1);
    }
    uVar7 = uVar7 + 1;
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_58);
  return;
}

Assistant:

void BG_FactorGraphCreator::Construct_AgentTypePair_Variables()
{    
    _m_var_indices.resize( _m_bg->GetNrAgents() );
    size_t nrATs=0;
    vector<size_t> nrTypes(_m_bg->GetNrAgents() );
    for(Index agI = 0; agI < _m_bg->GetNrAgents(); agI++)
    {
        nrTypes[agI] =  _m_bg->GetNrTypes(agI);
        if(_m_verbosity >= 2)
            cout << "Agent "<<agI<<" has " << nrTypes[agI] << " types."<<endl;
        nrATs += nrTypes[agI];
        _m_var_indices[agI].reserve( _m_bg->GetNrTypes(agI) );
    }
    if(_m_verbosity >= 1)
        cout << "FactorGraph has "<<nrATs<<" variables (agent-types)"<<endl;
   
    //reserve memory 
    for(Index agI = 0; agI < _m_bg->GetNrAgents(); agI++)
        _m_var_indices[agI].reserve( nrTypes[agI] );
    _m_vars.reserve(nrATs);

    Index atI = 0;
    for(Index agI = 0; agI < _m_bg->GetNrAgents(); agI++)
        for(Index tI = 0; tI < _m_bg->GetNrTypes(agI); tI++)
        {
            //Note variables for higher agents have higher indices!
            libDAI::Var v(atI, _m_bg->GetNrActions(agI));
            _m_var_indices[agI].push_back(atI);
            _m_vars.push_back(v);
            atI++;
        }

}